

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

void golf_json_object_set_float_array
               (JSON_Object *obj,char *name,float *arr,int n,float min,float max)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  vec_char_t data;
  int v_i;
  uchar *local_68;
  int aiStack_60 [2];
  char *local_58;
  float local_4c;
  float local_48;
  int local_44;
  JSON_Object *local_40;
  char *local_38;
  
  local_68 = (uchar *)0x0;
  aiStack_60[0] = 0;
  aiStack_60[1] = 0;
  local_58 = "json";
  local_40 = obj;
  local_38 = name;
  if (0 < n) {
    local_48 = max - min;
    uVar3 = 0;
    do {
      fVar5 = (arr[uVar3] - min) / local_48;
      if ((fVar5 < min) || (max < fVar5)) {
        local_4c = fVar5;
        golf_log_warning("Number too big");
        fVar5 = local_4c;
      }
      local_44 = (int)(fVar5 * 100000.0);
      iVar1 = vec_reserve_po2_((char **)&local_68,aiStack_60,aiStack_60 + 1,1,aiStack_60[0] + 4,
                               local_58);
      if (iVar1 == 0) {
        lVar2 = 0;
        do {
          lVar4 = (long)aiStack_60[0];
          aiStack_60[0] = aiStack_60[0] + 1;
          local_68[lVar4] = *(uchar *)((long)&local_44 + lVar2);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  golf_json_object_set_data(local_40,local_38,local_68,aiStack_60[0]);
  golf_free_tracked(local_68);
  return;
}

Assistant:

void golf_json_object_set_float_array(JSON_Object *obj, const char *name, float *arr, int n, float min, float max) {
    vec_char_t data;
    vec_init(&data, "json");

    for (int i = 0; i < n; i++) {
        float v = (arr[i] - min) / (max - min);
        if (v < min || v > max) golf_log_warning("Number too big");
        int v_i = (int)(v * (float)PRECISION);
        vec_pusharr(&data, (unsigned char *)&v_i, sizeof(v_i));
    }

    golf_json_object_set_data(obj, name, (unsigned char*)data.data, data.length);

    vec_deinit(&data);
}